

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::EntrySome(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  CallInfo CVar3;
  RecyclableObject *pRVar4;
  bool bVar5;
  uint32 length_00;
  undefined4 *puVar6;
  Var pvVar7;
  uint64 length_01;
  int in_stack_00000010;
  undefined1 local_a8 [8];
  AutoTagNativeLibraryEntry __tag;
  ArgumentReader args;
  BigIndex length;
  JsReentLock jsReentLock;
  CallInfo callInfo_local;
  RecyclableObject *obj;
  JavascriptArray *pArr;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  jsReentLock._24_8_ = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != jsReentLock._24_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x2343,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar5) goto LAB_00b8d725;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  __tag.entry.next = (Entry *)jsReentLock._24_8_;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)&__tag.entry.next,(CallInfo *)&jsReentLock.m_savedNoJsReentrancy);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  length.bigIndex = (uint64)pSVar1->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)length.bigIndex)->noJsReentrancy;
  ((ThreadContext *)length.bigIndex)->noJsReentrancy = true;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_a8,function,(CallInfo)jsReentLock._24_8_,
             L"Array.prototype.some",&stack0x00000000);
  if ((jsReentLock._24_8_ & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                ,0x234b,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar5) goto LAB_00b8d725;
    *puVar6 = 0;
  }
  if (((ulong)__tag.entry.next & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec42,L"Array.prototype.some");
  }
  BigIndex::BigIndex((BigIndex *)&args.super_Arguments.Values,0);
  obj = (RecyclableObject *)0x0;
  callInfo_local = (CallInfo)0x0;
  *(undefined1 *)(length.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  pvVar7 = Arguments::operator[]((Arguments *)&__tag.entry.next,0);
  TryGetArrayAndLength<Js::JavascriptArray::BigIndex>
            (pvVar7,pSVar1,L"Array.prototype.some",(JavascriptArray **)&obj,
             (RecyclableObject **)&callInfo_local,(BigIndex *)&args.super_Arguments.Values);
  JsReentLock::MutateArrayObject((JsReentLock *)&length.bigIndex);
  pRVar4 = obj;
  CVar3 = callInfo_local;
  *(undefined1 *)(length.bigIndex + 0x108) = 1;
  if ((int)args.super_Arguments.Values == -1) {
    if ((obj != (RecyclableObject *)0x0) && (length._0_8_ != 0xffffffff)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x235c,"(pArr == nullptr || length.IsUint32Max())",
                                  "pArr == nullptr || length.IsUint32Max()");
      if (!bVar5) {
LAB_00b8d725:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    pRVar4 = obj;
    CVar3 = callInfo_local;
    *(undefined1 *)(length.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    length_01 = BigIndex::GetBigIndex((BigIndex *)&args.super_Arguments.Values);
    pvVar7 = SomeHelper<unsigned_long>
                       ((JavascriptArray *)pRVar4,(TypedArrayBase *)0x0,(RecyclableObject *)CVar3,
                        length_01,(Arguments *)&__tag.entry.next,pSVar1);
  }
  else {
    *(undefined1 *)(length.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    length_00 = BigIndex::GetSmallIndex((BigIndex *)&args.super_Arguments.Values);
    pvVar7 = SomeHelper<unsigned_int>
                       ((JavascriptArray *)pRVar4,(TypedArrayBase *)0x0,(RecyclableObject *)CVar3,
                        length_00,(Arguments *)&__tag.entry.next,pSVar1);
  }
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_a8);
  *(undefined1 *)(length.bigIndex + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pvVar7;
}

Assistant:

Var JavascriptArray::EntrySome(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Array.prototype.some"));

        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Array_Prototype_some);

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Array.prototype.some"));
        }

        BigIndex length;
        JavascriptArray* pArr = nullptr;
        RecyclableObject* obj = nullptr;

        JS_REENTRANT(jsReentLock, TryGetArrayAndLength(args[0], scriptContext, _u("Array.prototype.some"), &pArr, &obj, &length));

        if (length.IsSmallIndex())
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SomeHelper(pArr, nullptr, obj, length.GetSmallIndex(), args, scriptContext));
        }
        Assert(pArr == nullptr || length.IsUint32Max()); // if pArr is not null lets make sure length is safe to cast, which will only happen if length is a uint32max
        JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SomeHelper(pArr, nullptr, obj, length.GetBigIndex(), args, scriptContext));
    }